

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_set_name(ggml_tensor *tensor,char *name)

{
  size_t i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (name[lVar1] == '\0') goto LAB_0011a1e0;
    tensor->name[lVar1] = name[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f);
  lVar1 = 0x3f;
LAB_0011a1e0:
  tensor->name[lVar1] = '\0';
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_name(struct ggml_tensor * tensor, const char * name) {
    size_t i;
    for (i = 0; i < sizeof(tensor->name) - 1 && name[i] != '\0'; i++) {
        tensor->name[i] = name[i];
    }
    tensor->name[i] = '\0';
    return tensor;
}